

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O0

Bool prvTidyIsPushed(TidyDocImpl *doc,Node *node)

{
  uint local_2c;
  int i;
  Lexer *lexer;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  local_2c = doc->lexer->istacksize;
  do {
    local_2c = local_2c - 1;
    if ((int)local_2c < 0) {
      return no;
    }
  } while (doc->lexer->istack[(int)local_2c].tag != node->tag);
  return yes;
}

Assistant:

Bool TY_(IsPushed)( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;
    int i;

    for (i = lexer->istacksize - 1; i >= 0; --i)
    {
        if (lexer->istack[i].tag == node->tag)
            return yes;
    }

    return no;
}